

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

string * lest::to_string<unsigned_long>(string *__return_storage_ptr__,unsigned_long *value)

{
  unsigned_long *in_RDX;
  string local_30;
  
  string_maker<unsigned_long>::to_string_abi_cxx11_
            (&local_30,(string_maker<unsigned_long> *)value,in_RDX);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_30);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string( T const & value )
{
    return string_maker<T>::to_string( value );
}